

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O3

string * __thiscall
VersionNode<(cmSystemTools::CompareOp)5>::Evaluate
          (string *__return_storage_ptr__,VersionNode<(cmSystemTools::CompareOp)5> *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *param_2,GeneratorExpressionContent *param_3,
          cmGeneratorExpressionDAGChecker *param_4)

{
  string *lhs;
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  
  lhs = (parameters->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  bVar1 = cmSystemTools::VersionCompare(OP_GREATER_EQUAL,lhs,lhs + 1);
  pcVar3 = "0";
  if (bVar1) {
    pcVar3 = "1";
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = "";
  if (bVar1) {
    pcVar2 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* /*context*/,
    const GeneratorExpressionContent* /*content*/,
    cmGeneratorExpressionDAGChecker* /*dagChecker*/) const override
  {
    return cmSystemTools::VersionCompare(Op, parameters.front(), parameters[1])
      ? "1"
      : "0";
  }